

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

string * __thiscall
kratos::SystemVerilogCodeGen::get_port_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Port *port)

{
  size_type *psVar1;
  uint64_t *puVar2;
  uint *puVar3;
  undefined1 this_00 [8];
  pointer begin;
  int iVar4;
  long *plVar5;
  long lVar6;
  const_iterator cVar7;
  InternalException *this_01;
  PortDirection direction;
  Var *var;
  Var *var_00;
  Var *var_01;
  string *in_R8;
  __hashtable *__h;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  undefined1 local_48 [8];
  string str;
  
  auStack_68 = (undefined1  [8])0x0;
  strs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_68,8);
  port_dir_to_str_abi_cxx11_
            ((string *)local_48,(kratos *)(ulong)*(uint *)&(this->stream_).field_0x188,direction);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  psVar1 = &str._M_string_length;
  if (local_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_48,str._M_string_length + 1);
  }
  iVar4 = (*this->_vptr_SystemVerilogCodeGen[0x17])(this);
  if ((char)iVar4 == '\0') {
    iVar4 = (*this->_vptr_SystemVerilogCodeGen[0x1a])(this);
    if (((char)iVar4 != '\0') || (*(long *)&(this->stream_).super_stringstream.field_0x108 != 0))
    goto LAB_001a7d24;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[6]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
               (char (*) [6])0x25212b);
  }
  else {
LAB_001a7d24:
    iVar4 = (*this->_vptr_SystemVerilogCodeGen[0x1a])(this);
    if ((char)iVar4 == '\0') {
      plVar5 = *(long **)&(this->stream_).super_stringstream.field_0x108;
      if (plVar5 == (long *)0x0) {
        (*this->_vptr_SystemVerilogCodeGen[0x2e])(local_48,this);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        if (str._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str._M_dataplus._M_p);
        }
      }
      else {
        (**(code **)(*plVar5 + 0xf8))(local_48);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        if (local_48 != (undefined1  [8])psVar1) {
          operator_delete((void *)local_48,str._M_string_length + 1);
        }
      }
    }
    else {
      plVar5 = (long *)__dynamic_cast(this,&Port::typeinfo,&EnumPort::typeinfo,0);
      if (plVar5 == (long *)0x0) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_48 = (undefined1  [8])psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"Unable to convert port to enum_def","");
        InternalException::InternalException(this_01,(string *)local_48);
        __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar6 = (**(code **)(*plVar5 + 0x160))(plVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar6 + 0x40)
                );
    }
  }
  if ((this->stream_).super_stringstream.field_0x8 == '\x01') {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
               (char (*) [7])0x24b697);
  }
  puVar3 = (uint *)(this->options_).package_name._M_string_length;
  if (((*puVar3 < 2) &&
      ((this->options_).package_name.field_2._M_allocated_capacity - (long)puVar3 < 5)) &&
     ((this->stream_).super_stringstream.field_0xf8 == '\0')) {
    local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
    puVar2 = &(this->options_).line_wrap;
    cVar7 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)puVar2,(key_type *)local_48);
    if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>._M_cur
        != (__node_type *)0x0) {
      cVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)puVar2,(key_type *)local_48);
      if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
          _M_cur == (__node_type *)0x0) goto LAB_001a805a;
      if (*(long *)((long)cVar7.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                          ._M_cur + 0x10) != 0) goto LAB_001a7e67;
    }
  }
  else {
LAB_001a7e67:
    iVar4 = (*this->_vptr_SystemVerilogCodeGen[0x18])(this);
    if ((char)iVar4 != '\0') {
      get_var_size_str_abi_cxx11_((string *)local_48,(kratos *)this,var);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      if (local_48 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_48,str._M_string_length + 1);
      }
    }
  }
  iVar4 = (*this->_vptr_SystemVerilogCodeGen[0x17])(this);
  if ((char)iVar4 == '\0') {
    iVar4 = (*this->_vptr_SystemVerilogCodeGen[0x1a])(this);
    if (((char)iVar4 == '\0') && (*(long *)&(this->stream_).super_stringstream.field_0x108 == 0)) {
      get_var_width_str_abi_cxx11_((string *)local_48,this,var_00);
      if (str._M_dataplus._M_p != (pointer)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      }
      if (local_48 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_48,str._M_string_length + 1);
      }
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->label_index_)._M_h._M_rehash_policy);
  puVar3 = (uint *)(this->options_).package_name._M_string_length;
  if (((*puVar3 < 2) &&
      ((this->options_).package_name.field_2._M_allocated_capacity - (long)puVar3 < 5)) &&
     ((this->stream_).super_stringstream.field_0xf8 == '\0')) {
    local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
    puVar2 = &(this->options_).line_wrap;
    cVar7 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)puVar2,(key_type *)local_48);
    if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>._M_cur
        == (__node_type *)0x0) goto LAB_001a7faf;
    cVar7 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)puVar2,(key_type *)local_48);
    if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>._M_cur
        == (__node_type *)0x0) {
LAB_001a805a:
      std::__throw_out_of_range("_Map_base::at");
    }
    if (*(long *)((long)cVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                        ._M_cur + 0x10) == 0) goto LAB_001a7faf;
  }
  iVar4 = (*this->_vptr_SystemVerilogCodeGen[0x18])(this);
  if ((char)iVar4 == '\0') {
    get_var_size_str_abi_cxx11_((string *)local_48,(kratos *)this,var_01);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    if (local_48 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_48,str._M_string_length + 1);
    }
  }
LAB_001a7faf:
  begin = strs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  this_00 = auStack_68;
  local_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48," ","");
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (__return_storage_ptr__,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             in_R8);
  if (local_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_48,str._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_port_str(Port* port) {
    std::vector<std::string> strs;
    strs.reserve(8);
    strs.emplace_back(port_dir_to_str(port->port_direction()));
    // we use logic for all inputs and outputs
    if (!port->is_struct() && !port->is_enum() && !port->raw_type_parametrized()) {
        strs.emplace_back("logic");
    } else if (port->is_enum()) {
        auto* enum_def = dynamic_cast<EnumPort*>(port);
        if (!enum_def) throw InternalException("Unable to convert port to enum_def");
        strs.emplace_back(enum_def->enum_type()->name);
    } else if (port->raw_type_parametrized()) {
        auto* p = port->get_raw_type_param();
        strs.emplace_back(p->to_string());
    } else {
        auto* ptr = reinterpret_cast<PortPackedStruct*>(port);
        strs.emplace_back(ptr->packed_struct()->struct_name);
    }
    if (port->is_signed()) strs.emplace_back("signed");
    if ((port->size().front() > 1 || port->size().size() > 1 || port->explicit_array() ||
         port->get_size_param(0)) &&
        port->is_packed()) {
        auto str = get_var_size_str(port);
        strs.emplace_back(str);
    }
    if (!port->is_struct() && !port->is_enum() && !port->raw_type_parametrized()) {
        auto const& var_width_str = get_var_width_str(port);
        if (!var_width_str.empty()) strs.emplace_back(var_width_str);
    }
    strs.emplace_back(port->name);

    if ((port->size().front() > 1 || port->size().size() > 1 || port->explicit_array() ||
         port->get_size_param(0)) &&
        !port->is_packed()) {
        auto str = get_var_size_str(port);
        strs.emplace_back(str);
    }
    return string::join(strs.begin(), strs.end(), " ");
}